

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O3

void convert_numerative_pron(char **list,NJDNode *node1,NJDNode *node2)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  char *__s1;
  ulong uVar4;
  ulong uVar5;
  char **ppcVar6;
  char buff [1024];
  char acStack_428 [1024];
  
  pcVar2 = NJDNode_get_string(node1);
  if ((*pcVar2 == '*') && (pcVar2[1] == '\0')) {
    return;
  }
  __s1 = *list;
  if (__s1 == (char *)0x0) {
    return;
  }
  uVar4 = 0;
  while (iVar1 = strcmp(__s1,pcVar2), iVar1 != 0) {
    __s1 = list[uVar4 + 2];
    uVar4 = uVar4 + 2;
    if (__s1 == (char *)0x0) {
      return;
    }
  }
  iVar1 = atoi(*(char **)((long)list + ((uVar4 & 0xffffffff) << 3 | 8)));
  if (iVar1 == 1) {
    ppcVar6 = njd_set_digit_rule_voiced_sound_symbol_list;
    uVar4 = 0;
    while( true ) {
      pcVar2 = NJDNode_get_pron(node2);
      cVar3 = *njd_set_digit_rule_voiced_sound_symbol_list[uVar4];
      uVar5 = 0;
      if (cVar3 == '\0') break;
      do {
        if (pcVar2[uVar5] != cVar3) goto LAB_00149efb;
        cVar3 = njd_set_digit_rule_voiced_sound_symbol_list[uVar4][uVar5 + 1];
        uVar5 = uVar5 + 1;
      } while (cVar3 != '\0');
      if (-1 < (int)uVar5) break;
LAB_00149efb:
      uVar4 = uVar4 + 2;
      if (uVar4 == 0x28) {
        return;
      }
    }
  }
  else {
    if (iVar1 != 2) {
      return;
    }
    ppcVar6 = njd_set_digit_rule_semivoiced_sound_symbol_list;
    uVar4 = 0;
    while( true ) {
      pcVar2 = NJDNode_get_pron(node2);
      cVar3 = *njd_set_digit_rule_semivoiced_sound_symbol_list[uVar4];
      uVar5 = 0;
      if (cVar3 == '\0') break;
      do {
        if (pcVar2[uVar5] != cVar3) goto LAB_00149eb6;
        cVar3 = njd_set_digit_rule_semivoiced_sound_symbol_list[uVar4][uVar5 + 1];
        uVar5 = uVar5 + 1;
      } while (cVar3 != '\0');
      if (-1 < (int)uVar5) break;
LAB_00149eb6:
      uVar4 = uVar4 + 2;
      if (uVar4 == 10) {
        return;
      }
    }
  }
  strcpy(acStack_428,*(char **)((long)ppcVar6 + ((uVar4 & 0xffffffff) << 3 | 8)));
  strcat(acStack_428,pcVar2 + (uVar5 & 0xffffffff));
  NJDNode_set_pron(node2,acStack_428);
  return;
}

Assistant:

static void convert_numerative_pron(const char *list[], NJDNode * node1, NJDNode * node2)
{
   int i, j;
   int type = 0;
   const char *str = NJDNode_get_string(node1);
   char buff[MAXBUFLEN];

   if (strcmp(str, "*") == 0)
      return;
   for (i = 0; list[i] != NULL; i += 2) {
      if (strcmp(list[i], str) == 0) {
         type = atoi(list[i + 1]);
         break;
      }
   }
   if (type == 1) {
      for (i = 0; njd_set_digit_rule_voiced_sound_symbol_list[i] != NULL; i += 2) {
         str = NJDNode_get_pron(node2);
         j = strtopcmp(str, njd_set_digit_rule_voiced_sound_symbol_list[i]);
         if (j >= 0) {
            strcpy(buff, njd_set_digit_rule_voiced_sound_symbol_list[i + 1]);
            strcat(buff, &str[j]);
            NJDNode_set_pron(node2, buff);
            break;
         }
      }
   } else if (type == 2) {
      for (i = 0; njd_set_digit_rule_semivoiced_sound_symbol_list[i] != NULL; i += 2) {
         str = NJDNode_get_pron(node2);
         j = strtopcmp(str, njd_set_digit_rule_semivoiced_sound_symbol_list[i]);
         if (j >= 0) {
            strcpy(buff, njd_set_digit_rule_semivoiced_sound_symbol_list[i + 1]);
            strcat(buff, &str[j]);
            NJDNode_set_pron(node2, buff);
            break;
         }
      }
   }
}